

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O3

int TIFFAppendToStrip(TIFF *tif,uint32_t strip,uint8_t *data,tmsize_t cc)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  toff_t tVar4;
  void *p;
  ulong uVar5;
  tmsize_t tVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  char *pcVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  uint64_t uVar13;
  bool bVar14;
  
  uVar5 = tif->tif_curoff;
  if (uVar5 == 0) {
    tif->tif_lastvalidoff = 0;
    tVar4 = (tif->tif_dir).td_stripoffset_p[strip];
    bVar14 = tVar4 == 0;
LAB_002b398d:
    if ((tif->tif_dir).td_nstrips == 0) {
      __assert_fail("td->td_nstrips > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_write.c"
                    ,0x304,"int TIFFAppendToStrip(TIFF *, uint32_t, uint8_t *, tmsize_t)");
    }
    uVar5 = (tif->tif_dir).td_stripbytecount_p[strip];
    if ((uVar5 == 0) || (bVar14 || uVar5 < (ulong)cc)) {
      tVar4 = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
      puVar7 = (tif->tif_dir).td_stripoffset_p;
      puVar7[strip] = tVar4;
      pbVar1 = (byte *)((long)&tif->tif_flags + 2);
      *pbVar1 = *pbVar1 | 0x20;
      puVar8 = (tif->tif_dir).td_stripbytecount_p;
LAB_002b3a11:
      tif->tif_curoff = tVar4;
      uVar10 = puVar8[strip];
      puVar8[strip] = 0;
      uVar5 = tif->tif_curoff;
      goto LAB_002b3a2b;
    }
    iVar3 = _TIFFSeekOK(tif,tVar4);
    if (iVar3 != 0) {
      puVar7 = (tif->tif_dir).td_stripoffset_p;
      puVar8 = (tif->tif_dir).td_stripbytecount_p;
      tif->tif_lastvalidoff = puVar8[strip] + puVar7[strip];
      tVar4 = puVar7[strip];
      goto LAB_002b3a11;
    }
    uVar2 = tif->tif_row;
    pcVar9 = "Seek error at scanline %lu";
LAB_002b3c1d:
    TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar9,(ulong)uVar2);
  }
  else {
    puVar7 = (tif->tif_dir).td_stripoffset_p;
    uVar10 = 0xffffffffffffffff;
    if (puVar7[strip] == 0) {
      bVar14 = true;
      tVar4 = 0;
      goto LAB_002b398d;
    }
LAB_002b3a2b:
    uVar11 = uVar5 + cc & 0xffffffff;
    if ((tif->tif_flags & 0x80000) != 0) {
      uVar11 = uVar5 + cc;
    }
    if (uVar11 < uVar5 || uVar11 < (ulong)cc) {
LAB_002b3a4a:
      pcVar9 = "Maximum TIFF file size exceeded";
    }
    else {
      if (((tif->tif_lastvalidoff == 0) || (uVar11 <= tif->tif_lastvalidoff)) ||
         (uVar5 = (tif->tif_dir).td_stripbytecount_p[strip], uVar5 == 0)) {
LAB_002b3bb3:
        tVar6 = (*tif->tif_writeproc)(tif->tif_clientdata,data,cc);
        if (tVar6 == cc) {
          tif->tif_curoff = uVar11;
          puVar7 = (tif->tif_dir).td_stripbytecount_p;
          uVar13 = cc + puVar7[strip];
          puVar7[strip] = uVar13;
          if (uVar13 == uVar10) {
            return 1;
          }
          pbVar1 = (byte *)((long)&tif->tif_flags + 2);
          *pbVar1 = *pbVar1 | 0x20;
          return 1;
        }
        uVar2 = tif->tif_row;
        pcVar9 = "Write error at scanline %lu";
        goto LAB_002b3c1d;
      }
      uVar11 = 0x100000;
      if (uVar5 < 0x100000) {
        uVar11 = uVar5;
      }
      uVar13 = puVar7[strip];
      tVar4 = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
      if (((tif->tif_flags & 0x80000) == 0) && (cc + uVar5 + tVar4 >> 0x20 != 0)) goto LAB_002b3a4a;
      p = _TIFFmallocExt(tif,uVar11);
      if (p != (void *)0x0) {
        pbVar1 = (byte *)((long)&tif->tif_flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
        (tif->tif_dir).td_stripoffset_p[strip] = tVar4;
        (tif->tif_dir).td_stripbytecount_p[strip] = 0;
        lVar12 = -uVar5;
        do {
          iVar3 = _TIFFSeekOK(tif,uVar13);
          if (iVar3 == 0) {
LAB_002b3c4d:
            pcVar9 = "Seek error";
LAB_002b3c7b:
            TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar9);
            _TIFFfreeExt(tif,p);
            return 0;
          }
          uVar5 = (*tif->tif_readproc)(tif->tif_clientdata,p,uVar11);
          if (uVar5 != uVar11) {
            pcVar9 = "Cannot read";
            goto LAB_002b3c7b;
          }
          iVar3 = _TIFFSeekOK(tif,tVar4);
          if (iVar3 == 0) goto LAB_002b3c4d;
          uVar5 = (*tif->tif_writeproc)(tif->tif_clientdata,p,uVar11);
          if (uVar5 != uVar11) {
            pcVar9 = "Cannot write";
            goto LAB_002b3c7b;
          }
          uVar13 = uVar13 + uVar11;
          tVar4 = tVar4 + uVar11;
          puVar7 = (tif->tif_dir).td_stripbytecount_p + strip;
          *puVar7 = *puVar7 + uVar11;
          lVar12 = lVar12 + uVar11;
        } while (lVar12 != 0);
        _TIFFfreeExt(tif,p);
        uVar11 = tVar4 + cc;
        goto LAB_002b3bb3;
      }
      pcVar9 = "No space for output buffer";
    }
    TIFFErrorExtR(tif,"TIFFAppendToStrip",pcVar9);
  }
  return 0;
}

Assistant:

static int TIFFAppendToStrip(TIFF *tif, uint32_t strip, uint8_t *data,
                             tmsize_t cc)
{
    static const char module[] = "TIFFAppendToStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t m;
    int64_t old_byte_count = -1;

    if (tif->tif_curoff == 0)
        tif->tif_lastvalidoff = 0;

    if (td->td_stripoffset_p[strip] == 0 || tif->tif_curoff == 0)
    {
        assert(td->td_nstrips > 0);

        if (td->td_stripbytecount_p[strip] != 0 &&
            td->td_stripoffset_p[strip] != 0 &&
            td->td_stripbytecount_p[strip] >= (uint64_t)cc)
        {
            /*
             * There is already tile data on disk, and the new tile
             * data we have will fit in the same space.  The only
             * aspect of this that is risky is that there could be
             * more data to append to this strip before we are done
             * depending on how we are getting called.
             */
            if (!SeekOK(tif, td->td_stripoffset_p[strip]))
            {
                TIFFErrorExtR(tif, module, "Seek error at scanline %lu",
                              (unsigned long)tif->tif_row);
                return (0);
            }

            tif->tif_lastvalidoff =
                td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip];
        }
        else
        {
            /*
             * Seek to end of file, and set that as our location to
             * write this strip.
             */
            td->td_stripoffset_p[strip] = TIFFSeekFile(tif, 0, SEEK_END);
            tif->tif_flags |= TIFF_DIRTYSTRIP;
        }

        tif->tif_curoff = td->td_stripoffset_p[strip];

        /*
         * We are starting a fresh strip/tile, so set the size to zero.
         */
        old_byte_count = td->td_stripbytecount_p[strip];
        td->td_stripbytecount_p[strip] = 0;
    }

    m = tif->tif_curoff + cc;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
        m = (uint32_t)m;
    if ((m < tif->tif_curoff) || (m < (uint64_t)cc))
    {
        TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
        return (0);
    }

    if (tif->tif_lastvalidoff != 0 && m > tif->tif_lastvalidoff &&
        td->td_stripbytecount_p[strip] > 0)
    {
        /* Ouch: we have detected that we are rewriting in place a strip/tile */
        /* with several calls to TIFFAppendToStrip(). The first call was with */
        /* a size smaller than the previous size of the strip/tile, so we */
        /* opted to rewrite in place, but a following call causes us to go */
        /* outsize of the strip/tile area, so we have to finally go for a */
        /* append-at-end-of-file strategy, and start by moving what we already
         */
        /* wrote. */
        tmsize_t tempSize;
        void *temp;
        uint64_t offsetRead;
        uint64_t offsetWrite;
        uint64_t toCopy = td->td_stripbytecount_p[strip];

        if (toCopy < 1024 * 1024)
            tempSize = (tmsize_t)toCopy;
        else
            tempSize = 1024 * 1024;

        offsetRead = td->td_stripoffset_p[strip];
        offsetWrite = TIFFSeekFile(tif, 0, SEEK_END);

        m = offsetWrite + toCopy + cc;
        if (!(tif->tif_flags & TIFF_BIGTIFF) && m != (uint32_t)m)
        {
            TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
            return (0);
        }

        temp = _TIFFmallocExt(tif, tempSize);
        if (temp == NULL)
        {
            TIFFErrorExtR(tif, module, "No space for output buffer");
            return (0);
        }

        tif->tif_flags |= TIFF_DIRTYSTRIP;

        td->td_stripoffset_p[strip] = offsetWrite;
        td->td_stripbytecount_p[strip] = 0;

        /* Move data written by previous calls to us at end of file */
        while (toCopy > 0)
        {
            if (!SeekOK(tif, offsetRead))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!ReadOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot read");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!SeekOK(tif, offsetWrite))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!WriteOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot write");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            offsetRead += tempSize;
            offsetWrite += tempSize;
            td->td_stripbytecount_p[strip] += tempSize;
            toCopy -= tempSize;
        }
        _TIFFfreeExt(tif, temp);

        /* Append the data of this call */
        offsetWrite += cc;
        m = offsetWrite;
    }

    if (!WriteOK(tif, data, cc))
    {
        TIFFErrorExtR(tif, module, "Write error at scanline %lu",
                      (unsigned long)tif->tif_row);
        return (0);
    }
    tif->tif_curoff = m;
    td->td_stripbytecount_p[strip] += cc;

    if ((int64_t)td->td_stripbytecount_p[strip] != old_byte_count)
        tif->tif_flags |= TIFF_DIRTYSTRIP;

    return (1);
}